

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O3

ByteArray * __thiscall
EncodingTable::encodeTermination(ByteArray *__return_storage_ptr__,EncodingTable *this)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ByteArray::ByteArray(__return_storage_ptr__);
  if ((this->terminationEntry).hexLen != 0) {
    uVar1 = 0;
    do {
      uStack_28 = CONCAT17((this->hexData).data_[uVar1 + (this->terminationEntry).hexPos],
                           (undefined7)uStack_28);
      ByteArray::append(__return_storage_ptr__,(void *)((long)&uStack_28 + 7),1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->terminationEntry).hexLen);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray EncodingTable::encodeTermination()
{
	ByteArray result;

	TableEntry& entry = terminationEntry;
	for (size_t i = 0; i < entry.hexLen; i++)
	{
		result.appendByte(hexData[entry.hexPos+i]);
	}

	return result;
}